

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

char * cmsys::SystemTools::ReplaceChars(char *str,char *toreplace,char replacement)

{
  char *pcVar1;
  char *ptr;
  char cVar2;
  char *ptr2;
  char *pcVar3;
  
  pcVar1 = str;
  if (str != (char *)0x0) {
    for (; cVar2 = *str, pcVar3 = toreplace, cVar2 != '\0'; str = str + 1) {
      for (; *pcVar3 != '\0'; pcVar3 = pcVar3 + 1) {
        if (cVar2 == *pcVar3) {
          *str = replacement;
          cVar2 = replacement;
        }
      }
    }
  }
  return pcVar1;
}

Assistant:

char* SystemTools::ReplaceChars(char* str, const char* toreplace,
                                char replacement)
{
  if (str) {
    char* ptr = str;
    while (*ptr) {
      const char* ptr2 = toreplace;
      while (*ptr2) {
        if (*ptr == *ptr2) {
          *ptr = replacement;
        }
        ++ptr2;
      }
      ++ptr;
    }
  }
  return str;
}